

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spreadhash.cpp
# Opt level: O3

uint64_t SS_GenHashSeed(int index)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  long *plVar4;
  ulong uVar5;
  char cVar6;
  uint64_t y;
  uint64_t x;
  long local_18;
  uchar local_10 [8];
  
  plVar4 = &local_18;
  if (SS_seed == 0) {
    iVar1 = rand();
    SS_seed = (uint64_t)iVar1;
  }
  local_18 = (long)index + SS_seed;
  SS_mangle((uchar *)&local_18,local_10,8);
  uVar3 = 0x172a550d;
  uVar5 = 0x10;
  cVar6 = '\0';
  do {
    if ((uVar5 & 1) == 0) {
      cVar6 = *(char *)plVar4;
      plVar4 = (long *)((long)plVar4 + 1);
    }
    iVar1 = ((uint)uVar5 & 1) << 2;
    uVar2 = (int)cVar6 >> iVar1;
    uVar3 = (long)(short)((int)((uint)(ushort)((short)uVar2 >> 0xf) << 0x10 | uVar2 & 0xffff) %
                         (int)(short)(0x10 << iVar1)) + uVar3 * 0x172a554f;
    uVar5 = uVar5 - 1;
  } while (uVar5 != 0);
  return uVar3 ^ 0x46253dc2;
}

Assistant:

uint64_t SS_GenHashSeed(int index) {
	/*
	if (index == 0) {
		srand(0);
	}
	*/
	if (SS_seed == 0) {
		SS_seed = rand();
	}
	uint64_t x, y = SS_seed + index;
	SS_mangle((const unsigned char*)&y, (unsigned char*)&x, 8);
	return SS_AwareHash((uint8_t*)&y, 8, 388650253, 388650319, 1176845762);
}